

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::sphereTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,float radius,
          bool allowHitSurface)

{
  undefined8 uVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar13;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar14 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar24;
  undefined1 in_register_00001384 [12];
  undefined1 auVar25 [16];
  
  aVar24 = center.field_2;
  auVar23._8_56_ = center._8_56_;
  auVar23._0_8_ = center._0_8_;
  aVar21 = rayDir.field_2;
  aVar13 = raySource.field_2;
  auVar12._8_56_ = raySource._8_56_;
  auVar12._0_8_ = raySource._0_8_;
  fVar9 = aVar13.z - aVar24.z;
  auVar19 = auVar23._0_16_;
  auVar20 = vsubps_avx(auVar12._0_16_,auVar19);
  aVar2 = rayDir.field_0;
  fVar10 = auVar20._0_4_;
  auVar25._0_4_ = fVar10 * aVar2.x;
  aVar3 = rayDir.field_1;
  fVar15 = auVar20._4_4_;
  auVar25._4_4_ = fVar15 * aVar3.y;
  fVar18 = rayDir.field_2;
  fVar16 = auVar20._8_4_;
  auVar25._8_4_ = fVar16 * fVar18;
  fVar4 = rayDir._12_4_;
  fVar17 = auVar20._12_4_;
  auVar25._12_4_ = fVar17 * fVar4;
  auVar14._0_4_ = fVar10 * fVar10;
  auVar14._4_4_ = fVar15 * fVar15;
  auVar14._8_4_ = fVar16 * fVar16;
  auVar14._12_4_ = fVar17 * fVar17;
  auVar20 = vhaddps_avx(auVar25,auVar25);
  fVar10 = fVar9 * aVar21.z + auVar20._0_4_;
  auVar20 = vhaddps_avx(auVar14,auVar14);
  fVar10 = fVar10 + fVar10;
  auVar8._4_12_ = in_register_00001384;
  auVar8._0_4_ = radius;
  auVar6._4_12_ = in_register_00001384;
  auVar6._0_4_ = radius;
  auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ + fVar9 * fVar9)),auVar8,auVar6);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * -4.0)),ZEXT416((uint)fVar10),
                            ZEXT416((uint)fVar10));
  fVar9 = auVar20._0_4_;
  if (fVar9 < 1e-06 || !allowHitSurface) {
    auVar20 = vsubps_avx(auVar19,auVar12._0_16_);
    auVar11._0_4_ = auVar20._0_4_ * aVar2.x;
    auVar11._4_4_ = auVar20._4_4_ * aVar3.y;
    auVar11._8_4_ = auVar20._8_4_ * fVar18;
    auVar11._12_4_ = auVar20._12_4_ * fVar4;
    auVar20 = vhaddps_avx(auVar11,auVar11);
    fVar10 = (aVar24.z - aVar13.z) * aVar21.z + auVar20._0_4_;
    fVar9 = 0.0;
    if (0.0 <= fVar10) {
      auVar22._0_4_ = fVar10 * aVar2.x + raySource.field_0.x;
      auVar22._4_4_ = fVar10 * aVar3.y + raySource.field_1.y;
      auVar22._8_4_ = fVar10 * fVar18 + raySource.field_2;
      auVar22._12_4_ = fVar10 * fVar4 + raySource._12_4_;
      fVar9 = aVar13.z + fVar10 * aVar21.z;
      auVar20 = vsubps_avx(auVar22,auVar19);
      uVar1 = vmovlps_avx(auVar22);
      p_Var7 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      auVar19._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar19._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar19._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar19._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar20 = vhaddps_avx(auVar19,auVar19);
      auVar20 = ZEXT416((uint)((fVar9 - aVar24.z) * (fVar9 - aVar24.z) + auVar20._0_4_));
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      fVar18 = auVar20._0_4_ - radius;
    }
    else {
      fVar10 = -1.0;
      fVar18 = INFINITY;
      p_Var7 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    }
  }
  else {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar8 = vxorps_avx512vl(ZEXT416((uint)fVar10),auVar5);
    if (fVar9 < 0.0) {
      fVar10 = sqrtf(fVar9);
    }
    else {
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      fVar10 = auVar20._0_4_;
    }
    fVar10 = (auVar8._0_4_ - fVar10) * 0.5;
    if (0.0 <= fVar10) {
      auVar20._0_4_ = fVar10 * aVar2.x + raySource.field_0.x;
      auVar20._4_4_ = fVar10 * aVar3.y + raySource.field_1.y;
      auVar20._8_4_ = fVar10 * fVar18 + raySource.field_2;
      auVar20._12_4_ = fVar10 * fVar4 + raySource._12_4_;
      fVar9 = aVar13.z + fVar10 * aVar21.z;
      fVar18 = 0.0;
      uVar1 = vmovlps_avx(auVar20);
      p_Var7 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
    }
    else {
      fVar10 = -1.0;
      fVar18 = INFINITY;
      p_Var7 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      (p_Var7->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      fVar9 = 0.0;
    }
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z = fVar9
  ;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar18;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = fVar10;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::sphereTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, float radius,
                                                                    bool allowHitSurface) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 oc = raySource - center;
  float b = 2. * dot(oc, rayDir);
  float c = glm::dot(oc, oc) - radius * radius;
  float disc = b * b - 4 * c;
  if (disc < 1e-6 || !allowHitSurface) {
    // miss, return nearest point
    float tHit = glm::dot(rayDir, center - raySource);
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    glm::vec3 hitPoint = raySource + tHit * rayDir;
    return ret_t{tHit, glm::length(hitPoint - center) - radius, hitPoint};
  } else {
    // actual hit
    float tHit = (-b - std::sqrt(disc)) / 2.;
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    return ret_t{tHit, 0, raySource + tHit * rayDir};
  }
}